

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

char * mg_get_builtin_mime_type(char *path)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  sVar2 = strlen(path);
  lVar4 = 0x10;
  while( true ) {
    if (lVar4 == 0x7a8) {
      return "text/plain";
    }
    lVar3 = sVar2 - *(ulong *)(&UNK_0013c008 + lVar4);
    if ((*(ulong *)(&UNK_0013c008 + lVar4) <= sVar2 && lVar3 != 0) &&
       (iVar1 = mg_strcasecmp(path + lVar3,
                              *(char **)((long)&config_options[0x3a].default_value + lVar4)),
       iVar1 == 0)) break;
    lVar4 = lVar4 + 0x18;
  }
  return *(char **)((long)&builtin_mime_types[0].extension + lVar4);
}

Assistant:

CIVETWEB_API const char *
mg_get_builtin_mime_type(const char *path)
{
	const char *ext;
	size_t i, path_len;

	path_len = strlen(path);

	for (i = 0; builtin_mime_types[i].extension != NULL; i++) {
		ext = path + (path_len - builtin_mime_types[i].ext_len);
		if ((path_len > builtin_mime_types[i].ext_len)
		    && (mg_strcasecmp(ext, builtin_mime_types[i].extension) == 0)) {
			return builtin_mime_types[i].mime_type;
		}
	}

	return "text/plain";
}